

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O3

void __thiscall so_5::state_t::state_t(state_t *this,state_t *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  state_t *psVar4;
  undefined8 uVar5;
  size_t sVar6;
  _Any_data _Var7;
  
  paVar1 = &(this->m_state_name).field_2;
  this->m_target_agent = other->m_target_agent;
  (this->m_state_name)._M_dataplus._M_p = (pointer)paVar1;
  paVar2 = &(other->m_state_name).field_2;
  pcVar3 = (other->m_state_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(other->m_state_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_state_name).field_2 + 8) = uVar5;
  }
  else {
    (this->m_state_name)._M_dataplus._M_p = pcVar3;
    (this->m_state_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_state_name)._M_string_length = (other->m_state_name)._M_string_length;
  (other->m_state_name)._M_dataplus._M_p = (pointer)paVar2;
  (other->m_state_name)._M_string_length = 0;
  (other->m_state_name).field_2._M_local_buf[0] = '\0';
  psVar4 = other->m_initial_substate;
  this->m_parent_state = other->m_parent_state;
  this->m_initial_substate = psVar4;
  this->m_state_history = other->m_state_history;
  this->m_last_active_substate = other->m_last_active_substate;
  sVar6 = other->m_substate_count;
  this->m_nested_level = other->m_nested_level;
  this->m_substate_count = sVar6;
  _Var7 = (_Any_data)(ZEXT816(0) << 0x20);
  (this->m_on_enter).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_on_enter).super__Function_base._M_functor = _Var7;
  (this->m_on_enter)._M_invoker = (other->m_on_enter)._M_invoker;
  if ((other->m_on_enter).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar5 = *(undefined8 *)((long)&(other->m_on_enter).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_on_enter).super__Function_base._M_functor =
         *(undefined8 *)&(other->m_on_enter).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->m_on_enter).super__Function_base._M_functor + 8) = uVar5;
    (this->m_on_enter).super__Function_base._M_manager =
         (other->m_on_enter).super__Function_base._M_manager;
    *(_Any_data *)&(other->m_on_enter).super__Function_base._M_manager = _Var7;
  }
  (this->m_on_exit).super__Function_base._M_functor = _Var7;
  (this->m_on_exit).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_on_exit)._M_invoker = (other->m_on_exit)._M_invoker;
  if ((other->m_on_exit).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar5 = *(undefined8 *)((long)&(other->m_on_exit).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_on_exit).super__Function_base._M_functor =
         *(undefined8 *)&(other->m_on_exit).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->m_on_exit).super__Function_base._M_functor + 8) = uVar5;
    (this->m_on_exit).super__Function_base._M_manager =
         (other->m_on_exit).super__Function_base._M_manager;
    *(undefined1 (*) [16])&(other->m_on_exit).super__Function_base._M_manager = ZEXT816(0) << 0x20;
  }
  (this->m_time_limit)._M_t.
  super___uniq_ptr_impl<so_5::state_t::time_limit_t,_std::default_delete<so_5::state_t::time_limit_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::state_t::time_limit_t_*,_std::default_delete<so_5::state_t::time_limit_t>_>
  .super__Head_base<0UL,_so_5::state_t::time_limit_t_*,_false>._M_head_impl = (time_limit_t *)0x0;
  psVar4 = this->m_parent_state;
  if ((psVar4 != (state_t *)0x0) && (psVar4->m_initial_substate == other)) {
    psVar4->m_initial_substate = this;
    return;
  }
  return;
}

Assistant:

state_t::state_t(
	state_t && other )
	:	m_target_agent( other.m_target_agent )
	,	m_state_name( std::move( other.m_state_name ) )
	,	m_parent_state{ other.m_parent_state }
	,	m_initial_substate{ other.m_initial_substate }
	,	m_state_history{ other.m_state_history }
	,	m_last_active_substate{ other.m_last_active_substate }
	,	m_nested_level{ other.m_nested_level }
	,	m_substate_count{ other.m_substate_count }
	,	m_on_enter{ std::move(other.m_on_enter) }
	,	m_on_exit{ std::move(other.m_on_exit) }
{
	if( m_parent_state && m_parent_state->m_initial_substate == &other )
		m_parent_state->m_initial_substate = this;
}